

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmCommonTargetGenerator::AppendOSXVerFlag
          (cmCommonTargetGenerator *this,string *flags,string *lang,char *name,bool so)

{
  cmLocalCommonGenerator *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  int patch;
  int minor;
  int major;
  string fvar;
  ostringstream vflag;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  string local_1e8;
  string local_1c8 [32];
  ostream local_1a8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"CMAKE_",(allocator<char> *)&local_1a8);
  std::__cxx11::string::append((string *)&local_1e8);
  std::__cxx11::string::append((char *)&local_1e8);
  std::__cxx11::string::append((char *)&local_1e8);
  std::__cxx11::string::append((char *)&local_1e8);
  pcVar2 = cmMakefile::GetDefinition(this->Makefile,&local_1e8);
  if (pcVar2 != (char *)0x0) {
    cmGeneratorTarget::GetTargetVersion(this->GeneratorTarget,so,&local_1ec,&local_1f0,&local_1f4);
    if (((0 < local_1ec) || (0 < local_1f0)) || (0 < local_1f4)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar3 = std::operator<<(&local_1a8,pcVar2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1ec);
      poVar3 = std::operator<<(poVar3,".");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1f0);
      poVar3 = std::operator<<(poVar3,".");
      std::ostream::operator<<(poVar3,local_1f4);
      pcVar1 = this->LocalCommonGenerator;
      std::__cxx11::stringbuf::str();
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,flags,local_1c8);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendOSXVerFlag(std::string& flags,
                                               const std::string& lang,
                                               const char* name, bool so)
{
  // Lookup the flag to specify the version.
  std::string fvar = "CMAKE_";
  fvar += lang;
  fvar += "_OSX_";
  fvar += name;
  fvar += "_VERSION_FLAG";
  const char* flag = this->Makefile->GetDefinition(fvar);

  // Skip if no such flag.
  if (!flag) {
    return;
  }

  // Lookup the target version information.
  int major;
  int minor;
  int patch;
  this->GeneratorTarget->GetTargetVersion(so, major, minor, patch);
  if (major > 0 || minor > 0 || patch > 0) {
    // Append the flag since a non-zero version is specified.
    std::ostringstream vflag;
    vflag << flag << major << "." << minor << "." << patch;
    this->LocalCommonGenerator->AppendFlags(flags, vflag.str());
  }
}